

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variant.cpp
# Opt level: O1

ostream * __thiscall cali::Variant::write_cali(Variant *this,ostream *os)

{
  byte bVar1;
  anon_union_8_7_33918203_for_value aVar2;
  bool bVar3;
  _Alloc_hider _Var4;
  uint uVar5;
  char *__s;
  size_t sVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  char cVar10;
  size_type sVar11;
  size_t sVar12;
  cali_variant_t v;
  char buf [24];
  string local_58;
  
  uVar9 = (this->m_v).type_and_size;
  cVar10 = (char)os;
  switch(uVar9 & 0xff) {
  case 0:
    break;
  default:
    to_string_abi_cxx11_(&local_58,this);
    _Var4._M_p = local_58._M_dataplus._M_p;
    if (local_58._M_string_length != 0) {
      sVar11 = 0;
      do {
        bVar1 = _Var4._M_p[sVar11];
        if ((char)bVar1 < ' ') {
          if (bVar1 == 10) {
            std::ostream::put(cVar10);
            goto LAB_00192697;
          }
        }
        else {
          if ((bVar1 - 0x2c < 0x31) &&
             ((0x1000000020001U >> ((ulong)(bVar1 - 0x2c) & 0x3f) & 1) != 0)) {
            std::ostream::put(cVar10);
          }
LAB_00192697:
          std::ostream::put(cVar10);
        }
        sVar11 = sVar11 + 1;
      } while (local_58._M_string_length != sVar11);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    break;
  case 2:
    std::ostream::_M_insert<long>((long)os);
    break;
  case 3:
    iVar8 = 0;
    uVar9 = (this->m_v).value.v_uint;
    do {
      uVar5 = iVar8 + 0x17;
      *(byte *)((long)&local_58._M_dataplus._M_p + (ulong)uVar5) =
           (char)uVar9 + (char)(uVar9 / 10) * -10 | 0x30;
      iVar8 = iVar8 + -1;
      bVar3 = 9 < uVar9;
      uVar9 = uVar9 / 10;
    } while (bVar3);
    std::ostream::write((char *)os,(long)&local_58._M_dataplus._M_p + (ulong)uVar5);
    break;
  case 4:
    aVar2 = (anon_union_8_7_33918203_for_value)(this->m_v).value.unmanaged_ptr;
    v.value.unmanaged_ptr = (void *)aVar2.v_uint;
    v.type_and_size = uVar9;
    sVar7 = cali_variant_get_size(v);
    if (sVar7 != 0) {
      sVar12 = 0;
      do {
        bVar1 = *(byte *)((long)aVar2.unmanaged_ptr + sVar12);
        if ((char)bVar1 < ' ') {
          if (bVar1 == 10) {
LAB_0019271b:
            std::ostream::put(cVar10);
            goto LAB_00192728;
          }
        }
        else {
          if ((bVar1 - 0x2c < 0x31) &&
             ((0x1000000020001U >> ((ulong)(bVar1 - 0x2c) & 0x3f) & 1) != 0)) goto LAB_0019271b;
LAB_00192728:
          std::ostream::put(cVar10);
        }
        sVar12 = sVar12 + 1;
      } while (sVar7 != sVar12);
    }
    break;
  case 6:
    std::ostream::_M_insert<double>((this->m_v).value.v_double);
    break;
  case 8:
    __s = cali_type2string((this->m_v).value.v_type);
    if (__s == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar6 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar6);
    }
  }
  return os;
}

Assistant:

std::ostream& Variant::write_cali(std::ostream& os)
{
    cali_attr_type type = this->type();

    switch (type) {
    case CALI_TYPE_INV:
        break;
    case CALI_TYPE_INT:
        os << m_v.value.v_int;
        break;
    case CALI_TYPE_DOUBLE:
        os << m_v.value.v_double;
        break;
    case CALI_TYPE_UINT:
        util::write_uint64(os, m_v.value.v_uint);
        break;
    case CALI_TYPE_STRING:
        util::write_cali_esc_string(os, static_cast<const char*>(m_v.value.unmanaged_const_ptr), size());
        break;
    case CALI_TYPE_TYPE:
        os << cali_type2string(m_v.value.v_type);
        break;
    default:
        util::write_cali_esc_string(os, to_string());
    }

    return os;
}